

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O1

void __thiscall QGraphicsColorizeEffect::setStrength(QGraphicsColorizeEffect *this,qreal strength)

{
  long lVar1;
  double dVar2;
  qreal qVar3;
  undefined1 auVar4 [16];
  long in_FS_OFFSET;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  qreal local_30;
  void *local_28;
  qreal *pqStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  qVar3 = QPixmapColorizeFilter::strength(*(QPixmapColorizeFilter **)(lVar1 + 0xa8));
  dVar8 = qVar3 - strength;
  uVar5 = -(ulong)(dVar8 < -dVar8);
  uVar6 = -(ulong)(qVar3 < -qVar3);
  uVar7 = -(ulong)(strength < -strength);
  auVar10._0_8_ = ~uVar6 & (ulong)qVar3;
  auVar10._8_8_ = ~uVar7 & (ulong)strength;
  auVar4._8_8_ = (ulong)-strength & uVar7;
  auVar4._0_8_ = (ulong)-qVar3 & uVar6;
  dVar2 = SUB168(auVar10 | auVar4,8);
  dVar9 = SUB168(auVar10 | auVar4,0);
  if (dVar2 <= dVar9) {
    dVar9 = dVar2;
  }
  if (dVar9 < (double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5) * 1000000000000.0) {
    QPixmapColorizeFilter::setStrength(*(QPixmapColorizeFilter **)(lVar1 + 0xa8),strength);
    *(uint *)(lVar1 + 0xb0) = *(uint *)(lVar1 + 0xb0) & 0xfffffffe | (uint)(1e-12 < dVar2);
    lVar1 = *(long *)(*(long *)&(this->super_QGraphicsEffect).field_0x8 + 0x78);
    if (lVar1 != 0) {
      (**(code **)(**(long **)(lVar1 + 8) + 0x58))();
    }
    pqStack_20 = &local_30;
    local_28 = (void *)0x0;
    local_30 = strength;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsColorizeEffect::setStrength(qreal strength)
{
    Q_D(QGraphicsColorizeEffect);
    if (qFuzzyCompare(d->filter->strength(), strength))
        return;

    d->filter->setStrength(strength);
    d->opaque = !qFuzzyIsNull(strength);
    update();
    emit strengthChanged(strength);
}